

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Tree::has_child(Tree *this,size_t node,size_t ch)

{
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  
  if ((ch == 0xffffffffffffffff) || (this->m_cap <= ch)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return this->m_buf[ch].m_parent == node;
}

Assistant:

bool has_child(size_t node, size_t ch) const { return _p(ch)->m_parent == node; }